

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false>::
SetPropertyFromDescriptor<true,int>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false> *this,
          DynamicObject *instance,PropertyId propertyId,int propertyKey,
          SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  Type *pTVar1;
  ScriptContext *this_00;
  JavascriptString *this_01;
  code *pcVar2;
  uint propertyId_00;
  DynamicObject *pDVar3;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar4;
  bool bVar5;
  byte bVar6;
  PropertyAttributes PVar7;
  byte bVar8;
  charcount_t cVar9;
  int iVar10;
  BOOL BVar11;
  undefined4 *puVar12;
  JavascriptString **ppJVar13;
  PropertyRecord *string1;
  UndeclaredBlockVariable *pUVar14;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *pSVar15;
  PropertyRecord *pPVar16;
  unsigned_short uVar17;
  ushort local_4a;
  PropertyOperationFlags local_48;
  uint uStack_44;
  unsigned_short propertyIndex;
  DynamicObject *local_40;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *local_38;
  
  uStack_44 = propertyKey;
  local_40 = instance;
  local_38 = descriptor;
  if (instance == (DynamicObject *)0x0) {
    local_48 = flags;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x526,"(instance)","instance");
    if (!bVar5) goto LAB_00e2e7b2;
    *puVar12 = 0;
    flags = local_48;
  }
  pDVar3 = local_40;
  pTVar1 = (local_40->super_RecyclableObject).type.ptr;
  this_00 = (((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  bVar6 = local_38->Attributes;
  if ((bVar6 & 8) == 0) {
    if ((flags & PropertyOperation_AllowUndeclInConsoleScope) == PropertyOperation_None &&
        (bVar6 & 4) == 0) {
      JavascriptError::ThrowCantAssignIfStrictMode(flags,this_00);
      if (info == (PropertyValueInfo *)0x0) {
        return 0;
      }
      info->m_instance = &local_40->super_RecyclableObject;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
      return 0;
    }
  }
  else {
    if (((byte)this[9] & 4) != 0) {
      pSVar15 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
                ConvertToNonSharedSimpleDictionaryType
                          ((SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                            *)this,local_40);
      iVar10 = (*(pSVar15->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x17])
                         (pSVar15,pDVar3,(ulong)uStack_44,value,(ulong)flags,info);
      return iVar10;
    }
    if (*(char *)&pTVar1[1].javascriptLibrary.ptr == '\x01') {
      if ((((byte)this[9] & 0x10) != 0) ||
         (*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01')) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x547,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar5) goto LAB_00e2e7b2;
        *puVar12 = 0;
      }
      DynamicObject::ChangeType(local_40);
    }
    local_48 = flags;
    if ((((byte)this[0x28] & 2) != 0) &&
       (bVar5 = SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_false>
                ::TryUndeleteProperty
                          ((SimpleDictionaryUnorderedTypeHandler<unsigned_short,_Js::JavascriptString_*,_false>
                            *)this,local_40,local_38->propertyIndex,&local_4a), bVar5)) {
      ppJVar13 = JsUtil::
                 BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetKeyAt(*(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                              **)(this + 0x18),(uint)local_4a);
      this_01 = *ppJVar13;
      pPVar16 = ScriptContext::GetPropertyName(this_00,uStack_44);
      cVar9 = JavascriptString::GetLength(this_01);
      if ((cVar9 == pPVar16->byteCount >> 1) && (0xf < (uint)pPVar16->pid)) {
        string1 = (PropertyRecord *)JavascriptString::GetString(this_01);
        cVar9 = JavascriptString::GetLength(this_01);
        if ((string1 != pPVar16 + 1) &&
           (iVar10 = PAL_wmemcmp((char16_t *)string1,(char16_t *)(pPVar16 + 1),(ulong)cVar9),
           iVar10 != 0)) goto LAB_00e2e30e;
      }
      else {
LAB_00e2e30e:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x55e,
                                    "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)))"
                                    ,
                                    "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey))"
                                   );
        if (!bVar5) goto LAB_00e2e7b2;
        *puVar12 = 0;
      }
      local_38 = JsUtil::
                 BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetReferenceAt(*(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                                    **)(this + 0x18),(uint)local_4a);
    }
    bVar5 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
            SupportsSwitchingToUnordered
                      ((SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                        *)this,this_00);
    if (bVar5) {
      this[0x29] = (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,false>)
                   ((char)this[0x29] + -1);
    }
    local_38->Attributes = '\a';
    DynamicObject::SetHasNoEnumerableProperties(local_40,false);
    propertyId = uStack_44;
    if (uStack_44 != 0xffffffff) {
      ScriptContext::InvalidateProtoCaches(this_00,uStack_44);
    }
    local_38->Attributes = '\a';
    bVar6 = 7;
    flags = local_48;
  }
  if (local_38->propertyIndex == 0xffff) goto LAB_00e2e722;
  if (((-1 < (char)flags && 0x3f < bVar6) &&
      (pUVar14 = (UndeclaredBlockVariable *)
                 DynamicObject::GetSlot(local_40,(uint)local_38->propertyIndex),
      (flags >> 8 & 1) == 0)) &&
     ((((this_00->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr ==
      pUVar14)) {
    JavascriptError::ThrowReferenceError(this_00,-0x7ff5ec07,(PCWSTR)0x0);
  }
  if (*(long **)(this + 0x20) == (long *)0x0) {
    bVar5 = false;
  }
  else if ((DynamicObject *)**(long **)(this + 0x20) == local_40) {
    bVar5 = true;
  }
  else {
    AssertCount = AssertCount + 1;
    local_48 = flags;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x588,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar5) goto LAB_00e2e7b2;
    *puVar12 = 0;
    bVar5 = false;
    flags = local_48;
  }
  if ((*(byte *)local_38 & 2) == 0) {
    if ((((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
        (*(byte *)local_38 = *(byte *)local_38 | 2, bVar5)) &&
       ((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
        PropertyOperation_None && 0xf < uStack_44)) {
      if (((byte)this[9] & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x594,"(!GetIsShared())","!GetIsShared()");
        if (!bVar5) goto LAB_00e2e7b2;
        *puVar12 = 0;
      }
      if (value == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x595,"(value != nullptr)","value != nullptr");
        if (!bVar5) goto LAB_00e2e7b2;
        *puVar12 = 0;
      }
      BVar11 = RecyclableObject::IsExternal(&local_40->super_RecyclableObject);
      if (BVar11 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x597,"(!instance->IsExternal())","!instance->IsExternal()");
        if (!bVar5) {
LAB_00e2e7b2:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar12 = 0;
      }
      bVar5 = VarIs<Js::JavascriptFunction>(value);
      if (bVar5) {
        bVar5 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixMethodPropsPhase);
        bVar6 = *(byte *)local_38;
        if (bVar5) goto LAB_00e2e7a0;
LAB_00e2e79c:
        bVar8 = 4;
      }
      else {
        bVar5 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixDataPropsPhase);
        if (bVar5) {
          bVar6 = *(byte *)local_38;
        }
        else {
          bVar5 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(local_40,propertyId,value);
          bVar6 = *(byte *)local_38;
          if (bVar5) goto LAB_00e2e79c;
        }
LAB_00e2e7a0:
        bVar8 = 0;
      }
      *(byte *)local_38 = bVar6 & 0xfb | bVar8;
    }
  }
  else {
    pPVar16 = ScriptContext::GetPropertyName(this_00,uStack_44);
    InvalidateFixedField<Js::PropertyRecord_const*>
              (this,pPVar16,local_38,
               (((((local_40->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr);
  }
  pSVar4 = local_38;
  DynamicTypeHandler::SetSlotUnchecked(local_40,(uint)local_38->propertyIndex,value);
  if (((uint)*pSVar4 & 6) == 2) {
    if (info == (PropertyValueInfo *)0x0) goto LAB_00e2e722;
    PVar7 = local_38->Attributes;
    uVar17 = local_38->propertyIndex;
  }
  else {
    if (info == (PropertyValueInfo *)0x0) goto LAB_00e2e722;
    uVar17 = 0xffff;
    PVar7 = '\0';
  }
  info->m_instance = &local_40->super_RecyclableObject;
  info->m_propertyIndex = uVar17;
  info->m_attributes = PVar7;
  info->flags = InlineCacheNoFlags;
LAB_00e2e722:
  propertyId_00 = uStack_44;
  TPropertyKey_GetUpdateSideEffectPropertyId<int>(propertyId,uStack_44);
  if (propertyId_00 != 0xffffffff) {
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              ((DynamicTypeHandler *)this,local_40,propertyId_00,value,SideEffects_Any);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyFromDescriptor(DynamicObject* instance, PropertyId propertyId, TPropertyKey propertyKey, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        Assert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;

        if (!allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
        {
            // We have a shadowing case here.  An undeclared global property
            // is being added after a let/const was already declared.
            //
            // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
            // because we do not want to add another property index field to the
            // property descriptors.  Instead convert to DictionaryTypeHandler
            // where it will reuse one of the getter/setter fields on its
            // property descriptor type.
            return
                ConvertToDictionaryType(instance)
                    ->SetProperty(
                            instance,
                            propertyId,
                            value,
                            flags,
                            info);
        }

        if (descriptor->Attributes & PropertyDeleted)
        {
            if(GetIsLocked())
            {
                return
                    ConvertToNonSharedSimpleDictionaryType(instance)->SetProperty(instance, propertyKey, value, flags, info);
            }
            else if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            if (IsNotExtensibleSupported)
            {
                bool isForce = (flags & PropertyOperation_Force) != 0;
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return FALSE;
                    }
                }
            }

            if(isUnordered)
            {
                TPropertyIndex propertyIndex;
                if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                {
                    Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)));
                    descriptor = propertyMap->GetReferenceAt(propertyIndex);
                }
            }

            if(SupportsSwitchingToUnordered(scriptContext))
            {
                --numDeletedProperties;
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
            instance->SetHasNoEnumerableProperties(false);
            propertyId = TPropertyKey_GetOptionalPropertyId(instance->GetScriptContext(), propertyKey);
            if (propertyId != Constants::NoProperty)
            {
                scriptContext->InvalidateProtoCaches(propertyId);
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
        }
        else if (!(descriptor->Attributes & PropertyWritable) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
        {
            JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);

            // Since we separate LdFld and StFld caches there is no point in caching for StFld with non-writable properties, except perhaps
            // to prepopulate the type property cache (which we do share between LdFld and StFld), for potential future field loads. This
            // would require additional handling in CacheOperators::CachePropertyWrite, such that for !info-IsWritable() we don't populate
            // the local cache (that would be illegal), but still populate the type's property cache.
            PropertyValueInfo::SetNoCache(info, instance);
            return false;
        }

        if (descriptor->propertyIndex != NoSlots)
        {
            if ((descriptor->Attributes & PropertyNoRedecl) && !(flags & PropertyOperation_AllowUndecl))
            {
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(descriptor->propertyIndex)) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }

#if ENABLE_FIXED_FIELDS
            DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
            Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
            if (!descriptor->isInitialized)
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                    // some other special illegal value (for let or const), currently == null.
                    descriptor->isInitialized = true;
                    if (localSingletonInstance == instance &&
                        !TPropertyKey_IsInternalPropertyId(propertyKey) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(!GetIsShared());
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey), descriptor, instance->GetScriptContext());
            }
#endif

            SetSlotUnchecked(instance, descriptor->propertyIndex, value);

            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }

        propertyId = TPropertyKey_GetUpdateSideEffectPropertyId(propertyId, propertyKey);
        if (propertyId != Constants::NoProperty)
        {
            SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
        }
        return true;
    }